

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O0

string * RigidBodyDynamics::Utils::GetModelDOFOverview_abi_cxx11_(Model *model)

{
  _Ios_Openmode _Var1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  long in_RSI;
  string *in_RDI;
  uint j;
  uint i;
  uint q_index;
  SpatialVector *in_stack_00000188;
  stringstream result;
  ostream *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  _Setw in_stack_fffffffffffffcfc;
  allocator<char> *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  undefined1 *puVar6;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  uint uVar7;
  string local_270 [32];
  string local_250 [36];
  int local_22c;
  char local_225;
  uint local_224;
  string local_220 [32];
  string local_200 [36];
  int local_1dc;
  char local_1d5;
  uint local_1d4;
  uint local_1d0;
  allocator<char> local_1b9;
  string local_1b8 [32];
  stringstream local_198 [16];
  undefined1 local_188 [376];
  long local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),in_stack_fffffffffffffd08
             ,in_stack_fffffffffffffd00);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,local_1b8,_Var1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  local_1d0 = 0;
  for (local_1d4 = 1; uVar2 = (ulong)local_1d4,
      sVar3 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)(local_10 + 0x308)), uVar2 < sVar3; local_1d4 = local_1d4 + 1) {
    pvVar4 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(local_10 + 0xa0),(ulong)local_1d4);
    if (pvVar4->mDoFCount == 1) {
      local_1d5 = (char)std::setfill<char>(' ');
      poVar5 = std::operator<<(local_188,local_1d5);
      local_1dc = (int)std::setw(3);
      poVar5 = std::operator<<(poVar5,(_Setw)local_1dc);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1d0);
      poVar5 = std::operator<<(poVar5,": ");
      get_body_name_abi_cxx11_
                ((Model *)CONCAT44(in_stack_fffffffffffffcfc._M_n,in_stack_fffffffffffffcf8),
                 (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      poVar5 = std::operator<<(poVar5,local_200);
      poVar5 = std::operator<<(poVar5,"_");
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_10 + 0xb8),(ulong)local_1d4);
      get_dof_name_abi_cxx11_(in_stack_00000188);
      poVar5 = std::operator<<(poVar5,local_220);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string(local_200);
      local_1d0 = local_1d0 + 1;
    }
    else {
      local_224 = 0;
      while (uVar7 = local_224,
            pvVar4 = std::
                     vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                     ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   *)(local_10 + 0xa0),(ulong)local_1d4), uVar7 < pvVar4->mDoFCount)
      {
        puVar6 = local_188;
        local_225 = (char)std::setfill<char>(' ');
        poVar5 = std::operator<<(puVar6,local_225);
        in_stack_fffffffffffffcfc = std::setw(3);
        local_22c = in_stack_fffffffffffffcfc._M_n;
        in_stack_fffffffffffffcf0 = std::operator<<(poVar5,in_stack_fffffffffffffcfc);
        poVar5 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffcf0,local_1d0);
        poVar5 = std::operator<<(poVar5,": ");
        get_body_name_abi_cxx11_
                  ((Model *)CONCAT44(in_stack_fffffffffffffcfc._M_n,in_stack_fffffffffffffcf8),
                   (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
        poVar5 = std::operator<<(poVar5,local_250);
        poVar5 = std::operator<<(poVar5,"_");
        std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
        operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                    *)(local_10 + 0xa0),(ulong)local_1d4);
        get_dof_name_abi_cxx11_(in_stack_00000188);
        poVar5 = std::operator<<(poVar5,local_270);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_270);
        std::__cxx11::string::~string(local_250);
        local_1d0 = local_1d0 + 1;
        local_224 = local_224 + 1;
      }
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

RBDL_DLLAPI std::string GetModelDOFOverview (const Model &model) {
	stringstream result ("");

	unsigned int q_index = 0;
	for (unsigned int i = 1; i < model.mBodies.size(); i++) {
		if (model.mJoints[i].mDoFCount == 1) {
			result << setfill(' ') << setw(3) << q_index << ": " << get_body_name(model, i) << "_" << get_dof_name (model.S[i]) << endl;
			q_index++;
		} else {
			for (unsigned int j = 0; j < model.mJoints[i].mDoFCount; j++) {
				result << setfill(' ') << setw(3) << q_index << ": " << get_body_name(model, i) << "_" << get_dof_name (model.mJoints[i].mJointAxes[j]) << endl;
				q_index++;
			}
		}
	}

	return result.str();
}